

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotErrorBarsEx<ImPlot::GetterError<float>>(char *label_id,GetterError<float> *getter)

{
  ImPlotContext *pIVar1;
  bool bVar2;
  ImU32 col;
  long lVar3;
  ImDrawList *this;
  int iVar4;
  int iVar5;
  float fVar6;
  ImVec2 IVar7;
  double dVar8;
  double dVar9;
  ImVec2 p1;
  ImVec2 p2;
  ImVec2 local_88;
  ImPlotPoint local_80;
  float local_6c;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar2 = BeginItem(label_id,-1);
  if (bVar2) {
    if ((GImPlot->FitThisFrame == true) && (iVar4 = getter->Count, 0 < iVar4)) {
      iVar5 = 0;
      do {
        lVar3 = (long)(((getter->Offset + iVar5) % iVar4 + iVar4) % iVar4) * (long)getter->Stride;
        IVar7 = (ImVec2)(double)*(float *)((long)getter->Xs + lVar3);
        dVar8 = (double)*(float *)((long)getter->Ys + lVar3);
        fVar6 = *(float *)((long)getter->Pos + lVar3);
        local_80.y = dVar8 - (double)*(float *)((long)getter->Neg + lVar3);
        local_80.x = (double)IVar7;
        FitPoint(&local_80);
        local_80.y = (double)fVar6 + dVar8;
        local_80.x = (double)IVar7;
        FitPoint(&local_80);
        iVar5 = iVar5 + 1;
        iVar4 = getter->Count;
      } while (iVar5 < iVar4);
    }
    pIVar1 = GImPlot;
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar1->NextItemData).Colors + 4);
    iVar4 = getter->Count;
    if (0 < iVar4) {
      local_6c = (pIVar1->NextItemData).ErrorBarSize;
      local_48 = ZEXT416((uint)(local_6c * 0.5));
      local_58 = ZEXT416((uint)(local_6c * 0.5));
      iVar5 = 0;
      do {
        lVar3 = (long)(((getter->Offset + iVar5) % iVar4 + iVar4) % iVar4) * (long)getter->Stride;
        dVar8 = (double)*(float *)((long)getter->Xs + lVar3);
        dVar9 = (double)*(float *)((long)getter->Ys + lVar3);
        fVar6 = *(float *)((long)getter->Pos + lVar3);
        local_80.x = (double)PlotToPixels(dVar8,dVar9 - (double)*(float *)((long)getter->Neg + lVar3
                                                                          ),-1);
        local_60 = PlotToPixels(dVar8,(double)fVar6 + dVar9,-1);
        ImDrawList::AddLine(this,(ImVec2 *)&local_80,&local_60,col,
                            (pIVar1->NextItemData).ErrorBarWeight);
        if (0.0 < local_6c) {
          fVar6 = (float)((ulong)local_80.x >> 0x20);
          local_88.y = fVar6;
          local_88.x = SUB84(local_80.x,0) - (float)local_48._0_4_;
          local_68.y = fVar6 + (float)local_58._4_4_;
          local_68.x = SUB84(local_80.x,0) + (float)local_58._0_4_;
          ImDrawList::AddLine(this,&local_88,&local_68,col,(pIVar1->NextItemData).ErrorBarWeight);
          local_88.y = local_60.y;
          local_88.x = local_60.x - (float)local_48._0_4_;
          local_68.y = local_60.y + (float)local_58._4_4_;
          local_68.x = local_60.x + (float)local_58._0_4_;
          ImDrawList::AddLine(this,&local_88,&local_68,col,(pIVar1->NextItemData).ErrorBarWeight);
        }
        iVar5 = iVar5 + 1;
        iVar4 = getter->Count;
      } while (iVar5 < iVar4);
    }
    pIVar1 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar1->NextItemData);
    pIVar1->PreviousItem = pIVar1->CurrentItem;
    pIVar1->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotErrorBarsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X , e.Y - e.Neg));
                FitPoint(ImPlotPoint(e.X , e.Y + e.Pos ));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X, e.Y - e.Neg);
            ImVec2 p2 = PlotToPixels(e.X, e.Y + e.Pos);
            DrawList.AddLine(p1,p2,col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(half_whisker, 0), p1 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(half_whisker, 0), p2 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}